

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::FileInputStream::CopyingFileInputStream::Close(CopyingFileInputStream *this)

{
  int iVar1;
  int *piVar2;
  long in_RDI;
  LogMessage *other;
  LogMessage *in_stack_ffffffffffffff90;
  LogMessage *in_stack_ffffffffffffffa0;
  LogMessage local_48;
  
  if ((*(byte *)(in_RDI + 0xd) & 1) != 0) {
    other = &local_48;
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffffa0,(LogLevel)((ulong)in_RDI >> 0x20),
               (char *)in_stack_ffffffffffffff90,(int)((ulong)other >> 0x20));
    in_stack_ffffffffffffff90 =
         internal::LogMessage::operator<<(in_stack_ffffffffffffff90,(char *)other);
    internal::LogFinisher::operator=((LogFinisher *)in_stack_ffffffffffffff90,other);
    internal::LogMessage::~LogMessage((LogMessage *)0x5cad62);
  }
  *(undefined1 *)(in_RDI + 0xd) = 1;
  iVar1 = anon_unknown_4::close_no_eintr((int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    *(int *)(in_RDI + 0x10) = *piVar2;
  }
  return iVar1 == 0;
}

Assistant:

bool FileInputStream::CopyingFileInputStream::Close() {
  GOOGLE_CHECK(!is_closed_);

  is_closed_ = true;
  if (close_no_eintr(file_) != 0) {
    // The docs on close() do not specify whether a file descriptor is still
    // open after close() fails with EIO.  However, the glibc source code
    // seems to indicate that it is not.
    errno_ = errno;
    return false;
  }

  return true;
}